

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaK_code(FuncState *fs,Instruction i,int line)

{
  int iVar1;
  Proto *pPVar2;
  Instruction *pIVar3;
  int *piVar4;
  Proto *f;
  int line_local;
  Instruction i_local;
  FuncState *fs_local;
  
  pPVar2 = fs->f;
  dischargejpc(fs);
  if (pPVar2->sizecode < fs->pc + 1) {
    pIVar3 = (Instruction *)
             luaM_growaux_(fs->L,pPVar2->code,&pPVar2->sizecode,4,0x7ffffffd,"code size overflow");
    pPVar2->code = pIVar3;
  }
  pPVar2->code[fs->pc] = i;
  if (pPVar2->sizelineinfo < fs->pc + 1) {
    piVar4 = (int *)luaM_growaux_(fs->L,pPVar2->lineinfo,&pPVar2->sizelineinfo,4,0x7ffffffd,
                                  "code size overflow");
    pPVar2->lineinfo = piVar4;
  }
  pPVar2->lineinfo[fs->pc] = line;
  iVar1 = fs->pc;
  fs->pc = iVar1 + 1;
  return iVar1;
}

Assistant:

static int luaK_code(FuncState*fs,Instruction i,int line){
Proto*f=fs->f;
dischargejpc(fs);
luaM_growvector(fs->L,f->code,fs->pc,f->sizecode,Instruction,
(INT_MAX-2),"code size overflow");
f->code[fs->pc]=i;
luaM_growvector(fs->L,f->lineinfo,fs->pc,f->sizelineinfo,int,
(INT_MAX-2),"code size overflow");
f->lineinfo[fs->pc]=line;
return fs->pc++;
}